

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O3

EStatusCode __thiscall
AbstractContentContext::DrawImage
          (AbstractContentContext *this,double inX,double inY,string *inImagePath,
          ImageOptions *inOptions)

{
  undefined1 auVar1 [16];
  undefined4 extraout_EAX;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  ObjectIDTypeAndBool OVar14;
  DoubleAndDoublePair DVar15;
  double local_68;
  double local_60;
  undefined1 local_58 [12];
  undefined4 uStack_4c;
  string local_40;
  
  if (inOptions->transformationMethod == eFit) {
    local_60 = 0.0;
    DVar15 = PDFHummus::DocumentContext::GetImageDimensions
                       (this->mDocumentContext,inImagePath,inOptions->imageIndex,
                        &inOptions->pdfParsingOptions);
    auVar10._0_8_ = inOptions->boundingBoxWidth;
    auVar10._8_8_ = inOptions->boundingBoxHeight;
    if (inOptions->fitPolicy == eAlways) {
      auVar12 = divpd(auVar10,(undefined1  [16])DVar15);
    }
    else {
      uVar3 = -(ulong)((double)auVar10._0_8_ < DVar15.first);
      uVar4 = -(ulong)((double)auVar10._8_8_ < DVar15.second);
      auVar12._8_8_ = uVar4;
      auVar12._0_8_ = uVar3;
      iVar2 = movmskpd(extraout_EAX,auVar12);
      auVar12 = _DAT_002e3490;
      if (iVar2 != 0) {
        auVar10 = divpd(auVar10,(undefined1  [16])DVar15);
        auVar11._0_8_ = auVar10._0_8_ & uVar3;
        auVar11._8_8_ = auVar10._8_8_ & uVar4;
        auVar7._0_8_ = ~uVar3 & 0x3ff0000000000000;
        auVar7._8_8_ = ~uVar4 & 0x3ff0000000000000;
        auVar12 = auVar11 | auVar7;
      }
    }
    uVar5 = auVar12._8_4_;
    uVar6 = auVar12._12_4_;
    if (auVar12._0_8_ <= auVar12._8_8_) {
      uVar5 = auVar12._0_4_;
      uVar6 = auVar12._4_4_;
    }
    iVar2 = *(int *)&inOptions->fitProportional;
    auVar8._0_8_ = CONCAT44((iVar2 << 0x1f) >> 0x1f,(iVar2 << 0x1f) >> 0x1f);
    auVar8._8_4_ = (iVar2 << 0x1f) >> 0x1f;
    auVar8._12_4_ = (iVar2 << 0x1f) >> 0x1f;
    uVar3 = CONCAT44(uVar6,uVar5) & auVar8._8_8_;
    auVar9._0_8_ = ~auVar8._0_8_ & (ulong)auVar12._0_8_;
    auVar9._8_8_ = ~auVar8._8_8_ & (ulong)auVar12._8_8_;
    auVar1._8_4_ = (int)uVar3;
    auVar1._0_8_ = CONCAT44(uVar6,uVar5) & auVar8._0_8_;
    auVar1._12_4_ = (int)(uVar3 >> 0x20);
    _local_58 = auVar9 | auVar1;
    uVar5 = 0;
    uVar6 = 0;
    local_68 = 0.0;
    dVar13 = 0.0;
  }
  else if (inOptions->transformationMethod == eMatrix) {
    local_60 = inOptions->matrix[1];
    local_68 = inOptions->matrix[2];
    uVar5 = SUB84(inOptions->matrix[4],0);
    uVar6 = (undefined4)((ulong)inOptions->matrix[4] >> 0x20);
    dVar13 = inOptions->matrix[5];
    local_58._8_4_ = SUB84(inOptions->matrix[3],0);
    local_58._0_8_ = inOptions->matrix[0];
    uStack_4c = (int)((ulong)inOptions->matrix[3] >> 0x20);
  }
  else {
    local_60 = 0.0;
    stack0xffffffffffffffb0 = 1.0;
    local_58._0_8_ = 0x3ff0000000000000;
    uVar5 = 0;
    uVar6 = 0;
    local_68 = 0.0;
    dVar13 = 0.0;
  }
  OVar14 = PDFHummus::DocumentContext::RegisterImageForDrawing
                     (this->mDocumentContext,inImagePath,inOptions->imageIndex);
  if (((undefined1  [16])OVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    (*this->_vptr_AbstractContentContext[3])
              (this,inImagePath,inOptions->imageIndex,OVar14.first,&inOptions->pdfParsingOptions);
  }
  q(this);
  cm(this,(double)local_58._0_8_,local_60,local_68,stack0xffffffffffffffb0,
     (double)CONCAT44(uVar6,uVar5) + inX,dVar13 + inY);
  iVar2 = (*this->_vptr_AbstractContentContext[2])(this);
  ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_
            (&local_40,(ResourcesDictionary *)CONCAT44(extraout_var,iVar2),OVar14.first);
  Do(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  Q(this);
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::DrawImage(double inX,double inY,const std::string& inImagePath,const ImageOptions& inOptions)
{
	double transformation[6] = {1,0,0,1,0,0};

	if(inOptions.transformationMethod == eMatrix)
	{
		for(int i=0;i<6;++i)
			transformation[i] = inOptions.matrix[i];
	}
	else if(inOptions.transformationMethod == eFit)
	{
		DoubleAndDoublePair imageDimensions = mDocumentContext->GetImageDimensions(inImagePath,inOptions.imageIndex,inOptions.pdfParsingOptions);

        double scaleX = 1;
        double scaleY = 1;
                    
        if(inOptions.fitPolicy == eAlways)
        {
            scaleX = inOptions.boundingBoxWidth / imageDimensions.first;
            scaleY = inOptions.boundingBoxHeight / imageDimensions.second;
                        

        }
        else if(imageDimensions.first > inOptions.boundingBoxWidth || imageDimensions.second > inOptions.boundingBoxHeight) // overflow
        {
            scaleX = imageDimensions.first > inOptions.boundingBoxWidth ? inOptions.boundingBoxWidth / imageDimensions.first : 1;
            scaleY = imageDimensions.second > inOptions.boundingBoxHeight ? inOptions.boundingBoxHeight / imageDimensions.second : 1;
        }
                    
        if(inOptions.fitProportional)
        {
            scaleX = std::min(scaleX,scaleY);
            scaleY = scaleX;
        }
                    
        transformation[0] = scaleX;
        transformation[3] = scaleY;
	}

	transformation[4]+=inX;
	transformation[5]+=inY;

    // registering the images at pdfwriter to allow optimization on image writes
    ObjectIDTypeAndBool result = mDocumentContext->RegisterImageForDrawing(inImagePath,inOptions.imageIndex);
    if(result.second)
    {
        // if first usage, write the image
        ScheduleImageWrite(inImagePath,inOptions.imageIndex,result.first,inOptions.pdfParsingOptions);
    }
    
    q();
    cm(transformation[0],transformation[1],transformation[2],transformation[3],transformation[4],transformation[5]);
    Do(GetResourcesDictionary()->AddFormXObjectMapping(result.first));
    Q();
	return GetCurrentStatusCode();

}